

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O3

int __thiscall
ON_Mesh::AddNgon_Expert
          (ON_Mesh *this,uint Fcount,uint *ngon_fi,bool bPermitHoles,
          ON_MeshVertexFaceMap *vertexFaceMap)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  ON_SimpleArray<unsigned_int> ngon_vi;
  ON_MeshFaceList local_60;
  ON_3dPointListRef mesh_vertex_list;
  
  iVar3 = -1;
  if (ngon_fi != (uint *)0x0 && Fcount != 0) {
    ngon_vi._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0080d8d0;
    ngon_vi.m_a = (uint *)0x0;
    ngon_vi.m_count = 0;
    ngon_vi.m_capacity = 0;
    ON_3dPointListRef::ON_3dPointListRef(&mesh_vertex_list,this);
    ON_MeshFaceList::ON_MeshFaceList(&local_60,this);
    uVar2 = (this->m_F).m_count;
    bVar1 = HasNgons(this);
    uVar4 = 0;
    bVar6 = false;
    if (bVar1) {
      uVar4 = (this->m_Ngon).m_count;
      if (uVar4 == 0) {
        uVar4 = 0;
        bVar6 = false;
      }
      else {
        bVar6 = uVar2 == (this->m_NgonMap).m_count;
      }
    }
    uVar5 = 0;
    iVar3 = -1;
    do {
      if ((uVar2 <= ngon_fi[uVar5]) || ((bVar6 && ((this->m_NgonMap).m_a[ngon_fi[uVar5]] < uVar4))))
      goto LAB_00524d52;
      uVar5 = uVar5 + 1;
    } while (Fcount != uVar5);
    uVar2 = FindNgonBoundary_Helper
                      ((ON_3dPointListRef *)(ulong)mesh_vertex_list.m_point_count,&local_60,
                       (uint **)0x0,vertexFaceMap,(ulong)Fcount,ngon_fi,&ngon_vi,!bPermitHoles);
    if ((2 < uVar2) && (2 < ngon_vi.m_count)) {
      iVar3 = AddNgon(this,ngon_vi.m_count,ngon_vi.m_a,Fcount,ngon_fi);
    }
LAB_00524d52:
    ON_SimpleArray<unsigned_int>::~ON_SimpleArray(&ngon_vi);
  }
  return iVar3;
}

Assistant:

int ON_Mesh::AddNgon_Expert(
  unsigned int Fcount,
  const unsigned int* ngon_fi,
  bool bPermitHoles,
  ON_MeshVertexFaceMap* vertexFaceMap
)
{
  unsigned int ngon_index = ON_UNSET_UINT_INDEX;
  if (Fcount < 1 || nullptr == ngon_fi)
    return ngon_index;

  ON_SimpleArray<unsigned int> ngon_vi;
  const ON_3dPointListRef mesh_vertex_list(this);
  const ON_MeshFaceList& mesh_face_list(this);

  const int face_count = m_F.Count();
  const unsigned int ngon_count0 = HasNgons() ? NgonUnsignedCount() : 0U;
  bool bCheckNgonMap = (ngon_count0 > 0 && face_count == m_NgonMap.Count());
  for (unsigned int i = 0; i < Fcount; ++i)
  {
    unsigned int fi = ngon_fi[i];
    if (fi >= (unsigned int)face_count)
      return ngon_index;
    if (bCheckNgonMap && m_NgonMap[fi] < ngon_count0)
      return ngon_index; // input faces are already in an ngon
  }

  unsigned int vi_count;
  if (bPermitHoles)
    vi_count = ON_MeshNgon::FindNgonBoundary(
      mesh_vertex_list,
      mesh_face_list,
      vertexFaceMap,
      Fcount,
      ngon_fi,
      ngon_vi
    );
  else
    vi_count = ON_MeshNgon::FindNgonOuterBoundary(
      mesh_vertex_list,
      mesh_face_list,
      vertexFaceMap,
      Fcount,
      ngon_fi,
      ngon_vi
    );

  if (vi_count < 3 || ngon_vi.Count() < 3)
    return ngon_index; // 

  return AddNgon(ngon_vi.UnsignedCount(), ngon_vi.Array(), Fcount, ngon_fi);
}